

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O0

string * __thiscall
VulkanUtilities::VkAccessFlagsToString_abi_cxx11_
          (string *__return_storage_ptr__,VulkanUtilities *this,VkAccessFlags Flags)

{
  ulong uVar1;
  char *pcVar2;
  VkAccessFlags Bit;
  VkAccessFlags Flags_local;
  string *FlagsString;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (Bit = (VkAccessFlags)this; Bit != 0; Bit = Bit & Bit - 1) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    pcVar2 = VkAccessFlagBitToString
                       (Bit & (Bit - VK_ACCESS_INDIRECT_COMMAND_READ_BIT ^ ~VK_ACCESS_NONE));
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VkAccessFlagsToString(VkAccessFlags Flags)
{
    std::string FlagsString;
    while (Flags != 0)
    {
        auto Bit = Flags & ~(Flags - 1);
        if (!FlagsString.empty())
            FlagsString += ", ";
        FlagsString += VkAccessFlagBitToString(static_cast<VkAccessFlagBits>(Bit));
        Flags = Flags & (Flags - 1);
    }
    return FlagsString;
}